

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O2

void __thiscall UDPSplitPacketReader::read_packet(UDPSplitPacketReader *this)

{
  list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
  *this_00;
  ushort uVar1;
  ulong uVar2;
  _List_node_base *__n;
  _List_node_base *p_Var3;
  int __fd;
  const_iterator cVar4;
  const_iterator cVar5;
  ulong in_R8;
  iterator it;
  _List_node_base *p_Var6;
  _List_node_base **pp_Var7;
  
  this_00 = &this->receivedPackets;
LAB_001125b5:
  __n = (_List_node_base *)(long)this->max;
  if ((_List_node_base *)
      (this->receivedPackets).
      super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
      ._M_impl._M_node._M_size < __n) {
    if ((this->receivedPacket & 1U) == 0) goto LAB_0011263d;
LAB_001125cc:
    cVar5._M_node = (this->currentPacket)._M_node;
    this->receivedPacket = false;
  }
  else {
    if ((this->receivedPacket & 1U) != 0) goto LAB_001125cc;
    cVar5._M_node =
         (this->receivedPackets).
         super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
         ._M_impl._M_node.super__List_node_base._M_prev;
  }
  if (*(char *)&cVar5._M_node[5]._M_next == '\x01') {
    cVar4._M_node = cVar5._M_node[3]._M_prev;
    while (*(char *)&cVar4._M_node[5]._M_next == '\x01') {
      p_Var6 = cVar4._M_node[3]._M_prev;
      std::__cxx11::
      list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>::
      erase(this_00,cVar4);
      cVar4._M_node = p_Var6;
    }
    std::__cxx11::
    list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>::
    erase(this_00,cVar4);
  }
  if (*(char *)((long)&cVar5._M_node[5]._M_next + 1) == '\x01') {
    cVar4._M_node = cVar5._M_node[4]._M_next;
    while (*(char *)((long)&cVar4._M_node[5]._M_next + 1) == '\x01') {
      p_Var6 = cVar4._M_node[4]._M_next;
      std::__cxx11::
      list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>::
      erase(this_00,cVar4);
      cVar4._M_node = p_Var6;
    }
    std::__cxx11::
    list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>::
    erase(this_00,cVar4);
  }
  std::__cxx11::
  list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>::erase
            (this_00,cVar5);
LAB_0011263d:
  std::__cxx11::
  list<UDPSplitPacketReader::SplitPacket,std::allocator<UDPSplitPacketReader::SplitPacket>>::
  emplace_front<int&>((list<UDPSplitPacketReader::SplitPacket,std::allocator<UDPSplitPacketReader::SplitPacket>>
                       *)this_00,&this->mtu);
  p_Var6 = (this_00->
           super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  pp_Var7 = &p_Var6[4]._M_prev;
  do {
    __fd = (int)p_Var6[1]._M_prev;
    uVar2 = recv(this,__fd,(void *)(ulong)(uint)(*(int *)&p_Var6[2]._M_prev - __fd),(size_t)__n,
                 (int)in_R8);
    __n = p_Var6[1]._M_prev;
    p_Var6[3]._M_next = (_List_node_base *)((long)&__n->_M_next + (uVar2 & 0xffffffff));
    p_Var6[2]._M_next = (_List_node_base *)((long)&(p_Var6[2]._M_next)->_M_next + 4);
    p_Var3 = (this->receivedPackets).
             super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    cVar5._M_node = p_Var3;
    do {
      cVar5._M_node = (cVar5._M_node)->_M_next;
      if (cVar5._M_node == (_List_node_base *)this_00) {
        uVar1 = *(ushort *)((long)&__n->_M_next + 2);
        if (uVar1 < 0x4000) goto LAB_00112879;
        goto LAB_00112720;
      }
    } while ((*(short *)&__n->_M_next != *(short *)&(cVar5._M_node[1]._M_prev)->_M_next) ||
            (((*(ushort *)((long)&(cVar5._M_node[1]._M_prev)->_M_next + 2) ^
              *(ushort *)((long)&__n->_M_next + 2)) & 0x3fff) != 0));
    if (*(char *)&cVar5._M_node[5]._M_next == '\x01') {
      *(undefined1 *)&p_Var6[5]._M_next = 1;
      p_Var3 = cVar5._M_node[3]._M_prev;
      p_Var6[3]._M_prev = p_Var3;
      p_Var3[4]._M_next = p_Var6;
    }
    if (*(char *)((long)&cVar5._M_node[5]._M_next + 1) == '\x01') {
      *(undefined1 *)((long)&p_Var6[5]._M_next + 1) = 1;
      p_Var3 = cVar5._M_node[4]._M_next;
      p_Var6[4]._M_next = p_Var3;
      p_Var3[3]._M_prev = p_Var6;
    }
    *(undefined1 *)((long)&p_Var6[5]._M_next + 2) =
         *(undefined1 *)((long)&cVar5._M_node[5]._M_next + 2);
    p_Var6[4]._M_prev = cVar5._M_node[4]._M_prev;
    *(undefined1 *)((long)&p_Var6[5]._M_next + 3) =
         *(undefined1 *)((long)&cVar5._M_node[5]._M_next + 3);
    std::__cxx11::
    list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>::
    erase(this_00,cVar5);
  } while( true );
  while( true ) {
    in_R8 = (ulong)*(ushort *)&__n->_M_next;
    if ((*(ushort *)&__n->_M_next == *(ushort *)&(p_Var3[1]._M_prev)->_M_next) &&
       (((*(ushort *)((long)&(p_Var3[1]._M_prev)->_M_next + 2) ^ uVar1 + 1) & 0x3fff) == 0)) break;
LAB_00112720:
    p_Var3 = p_Var3->_M_next;
    if (p_Var3 == (_List_node_base *)this_00) goto LAB_00112767;
  }
  *(undefined1 *)((long)&p_Var3[5]._M_next + 1) = 1;
  p_Var3[4]._M_next = p_Var6;
  *(undefined1 *)&p_Var6[5]._M_next = 1;
  p_Var6[3]._M_prev = p_Var3;
  *(undefined1 *)((long)&p_Var6[5]._M_next + 3) = *(undefined1 *)((long)&p_Var3[5]._M_next + 3);
  __n = p_Var6[1]._M_prev;
  uVar1 = *(ushort *)((long)&__n->_M_next + 2);
LAB_00112767:
  if ((uVar1 & 0xc000) == 0x4000) {
    p_Var6[4]._M_prev = p_Var6;
    *(undefined1 *)((long)&p_Var6[5]._M_next + 2) = 1;
  }
  else {
    p_Var3 = (this_00->
             super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    do {
      p_Var3 = p_Var3->_M_next;
      if (p_Var3 == (_List_node_base *)this_00) goto LAB_00112781;
    } while ((*(short *)&__n->_M_next != *(short *)&(p_Var3[1]._M_prev)->_M_next) ||
            (((*(ushort *)((long)&(p_Var3[1]._M_prev)->_M_next + 2) ^ uVar1 + 0x3fff) & 0x3fff) != 0
            ));
    *(undefined1 *)&p_Var3[5]._M_next = 1;
    p_Var3[3]._M_prev = p_Var6;
    *(undefined1 *)((long)&p_Var6[5]._M_next + 1) = 1;
    p_Var6[4]._M_next = p_Var3;
    if (*(char *)((long)&p_Var3[5]._M_next + 2) == '\x01') {
      *(undefined1 *)((long)&p_Var6[5]._M_next + 2) = 1;
      p_Var6[4]._M_prev = p_Var3[4]._M_prev;
    }
    else if (((ulong)(p_Var3[1]._M_prev)->_M_next & 0xc0000000) == 0x40000000) {
      *(undefined1 *)((long)&p_Var6[5]._M_next + 2) = 1;
      p_Var6[4]._M_prev = p_Var3;
    }
  }
LAB_00112781:
  if (*(char *)((long)&p_Var6[5]._M_next + 2) == '\x01') {
    if (((ulong)p_Var6[5]._M_next & 0x1000000) != 0) {
LAB_00112875:
      p_Var6 = *pp_Var7;
LAB_00112879:
      (this->currentPacket)._M_node = p_Var6;
      this->receivedPacket = true;
      return;
    }
    while (*(char *)&p_Var6[5]._M_next == '\x01') {
      p_Var6 = p_Var6[3]._M_prev;
      if (*(char *)((long)&p_Var6[5]._M_next + 3) != '\0') goto LAB_00112875;
      *(undefined1 *)((long)&p_Var6[5]._M_next + 2) = 1;
      p_Var6[4]._M_prev = *pp_Var7;
    }
  }
  else if (((ulong)p_Var6[5]._M_next & 0x1000000) != 0) {
    while (*(char *)((long)&p_Var6[5]._M_next + 1) == '\x01') {
      p_Var6 = p_Var6[4]._M_next;
      if (*(char *)((long)&p_Var6[5]._M_next + 2) == '\x01') {
        pp_Var7 = &p_Var6[4]._M_prev;
        goto LAB_00112875;
      }
      *(undefined1 *)((long)&p_Var6[5]._M_next + 3) = 1;
    }
  }
  goto LAB_001125b5;
}

Assistant:

void UDPSplitPacketReader::read_packet() {
  while(1) {
    // erase old packets
    if (receivedPackets.size() >= max || receivedPacket) {
      list<SplitPacket>::iterator current;
      if(receivedPacket) {
        current = currentPacket;
        receivedPacket = false;
      } else {
        current = --receivedPackets.end();
      }
      if (current->hasNext) {
        list<SplitPacket>::iterator it;
        it = current->next;
        while (it->hasNext) {
          list<SplitPacket>::iterator temp;
          temp = it->next;
          receivedPackets.erase(it);
          it = temp;
        }
        receivedPackets.erase(it);
      }
      if (current->hasPrevious) {
        list<SplitPacket>::iterator it;
        it = current->previous;
        while (it->hasPrevious) {
          list<SplitPacket>::iterator temp;
          temp = it->previous;
          receivedPackets.erase(it);
          it = temp;
        }
        receivedPackets.erase(it);
      }
      receivedPackets.erase(current);
    }

    // create packet
    receivedPackets.emplace_front(mtu);
    list<SplitPacket>::iterator current;
    current = receivedPackets.begin();

    // read until copy not read;
    while (1) {
      // read packet
      int length = recv(current->buf_start, current->buf_end - current->buf_start);
      current->read_end = current->buf_start + length;
      current->buf_current += 4;

      //cout << current->getCount() << endl;
      //cout << *((uint32_t *)current->buf_start) << endl;

      // find copies
      list<SplitPacket>::iterator copy;
      for (copy = ++receivedPackets.begin(); copy != receivedPackets.end(); copy++) {
        if ((current->getID() == copy->getID()) && (current->getCount() == copy->getCount())) {
          break;
        }
      }
      // if copy found
      if (copy != receivedPackets.end()) {
        // replace old with new;
        if (copy->hasNext) {
          current->hasNext = true;
          current->next = copy->next;
          current->next->previous = current;
        }
        if (copy->hasPrevious) {
          current->hasPrevious = true;
          current->previous = copy->previous;
          current->previous->next = current;
        }
        current->hasStart = copy->hasStart;
        current->start = copy->start;
        current->hasEnd = copy->hasEnd;
        receivedPackets.erase(copy);
      } else {
        break;
      }
    }

    // if full packet
    if (current->isFull()) {
      currentPacket = current;
      receivedPacket = true;
      return;
    }

    // setup next and previous links
    // for start and middle packets
    if (!current->isEnd()) {
      // find the next one.
      list<SplitPacket>::iterator next;
      // findNext
      for (next = ++receivedPackets.begin(); next != receivedPackets.end(); next++) {
        if ((current->getID() == next->getID()) && (current->getNextCount() == next->getCount())) {
          break;
        }
      }
      // next found
      if (next != receivedPackets.end()) {
        next->hasPrevious = true;
        next->previous = current;
        current->hasNext = true;
        current->next = next;
        current->hasEnd = next->hasEnd;
      }
    // for end packets
    } else {
      current->hasEnd = true;
    }
    // for middle and end packets
    if (!current->isStart()) {
      list<SplitPacket>::iterator previous;
      // findPrevious
      // previous = findPrevious(current);
      for (previous = ++receivedPackets.begin(); previous != receivedPackets.end(); previous++) {
        if ((current->getID() == previous->getID()) && (current->getPreviousCount() == previous->getCount())) {
          break;
        }
      }
      // if previous found
      if (previous != receivedPackets.end()) {
        previous->hasNext = true;
        previous->next = current;
        current->hasPrevious = true;
        current->previous = previous;
        if(previous->hasStart) {
          current->hasStart = true;
          current->start = previous->start;
        } else if (previous->isStart()) {
          current->hasStart = true;
          current->start = previous;
        }
      }
    // for start packets
    } else {
      current->start = current;
      current->hasStart = true;
    }

    // shortcut
    if(current->hasStart && current->hasEnd) {
      currentPacket = current->start;
      receivedPacket = true;
      return;
    }

    // test if all packet available and propogate values of hasEnd and hasStart
    // if connected to or is a start packet
    if (current->hasStart) {
      list<SplitPacket>::iterator it;
      it = current;
      // Indicate to following packet that there is a start
      // or return if found an end
      while(it->hasNext) {
        it = it->next;
        if (it->hasEnd) {
          currentPacket = current->start;
          receivedPacket = true;
          return;
        }
        it->hasStart = true;
        it->start = current->start;
      }
    }
    // if connected to end packet
    if (current->hasEnd) {
      list<SplitPacket>::iterator it;
      it = current;
      while(it->hasPrevious) {
        it = it->previous;
        if (it->hasStart) {
          currentPacket = it->start;
          receivedPacket = true;
          return;
        }
        it->hasEnd = true;
      }
    }

  }
}